

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

void __thiscall MeCab::Writer::~Writer(Writer *this)

{
  this->_vptr_Writer = (_func_int **)&PTR__Writer_0016be80;
  whatlog::~whatlog(&this->what_);
  scoped_array<char>::~scoped_array(&(this->eon_format_).super_scoped_array<char>);
  scoped_array<char>::~scoped_array(&(this->unk_format_).super_scoped_array<char>);
  scoped_array<char>::~scoped_array(&(this->eos_format_).super_scoped_array<char>);
  scoped_array<char>::~scoped_array(&(this->bos_format_).super_scoped_array<char>);
  scoped_array<char>::~scoped_array(&(this->node_format_).super_scoped_array<char>);
  return;
}

Assistant:

Writer::~Writer() {}